

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
               (ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
                *e,double ref_solution)

{
  ostream *poVar1;
  ct_constant<8L> *in_R8;
  ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
  local_1e;
  ct_constant<8L> local_1b;
  ct_constant<6L> local_1a;
  ct_constant<4L> local_19;
  ct_constant<8L> ct8;
  ct_constant<6L> ct6;
  double dStack_18;
  ct_constant<4L> ct4;
  double ref_solution_local;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  *e_local;
  
  dStack_18 = ref_solution;
  viennamath::ct_constant<4L>::ct_constant(&local_19);
  viennamath::ct_constant<6L>::ct_constant(&local_1a);
  viennamath::ct_constant<8L>::ct_constant(&local_1b);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::operator<<(poVar1," at compile-time (4,6,8): ");
  viennamath::
  make_vector<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>
            (&local_1e,(viennamath *)&local_19,(ct_constant<4L> *)&local_1a,
             (ct_constant<6L> *)&local_1b,in_R8);
  evaluation_compiletime<1l,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>
  ::
  apply<viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
            (e,&local_1e,dStack_18);
  return;
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::ct_constant<4> ct4;
  viennamath::ct_constant<6> ct6;
  viennamath::ct_constant<8> ct8;

  std::cout << e << " at compile-time (4,6,8): ";
  evaluation_compiletime<viennamath::result_of::is_ct_evaluable<E>::value,
                         E
                        >::apply(e, viennamath::make_vector(ct4, ct6, ct8), ref_solution);

}